

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  BumpAllocator *pBVar1;
  Token endgenerate_00;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  AttrList attributes_00;
  AttrList attributes_01;
  Token rand_00;
  AttrList attributes_02;
  AttrList AVar2;
  AttrList attributes_03;
  Token keyword_00;
  Token keyword_01;
  Token name_00;
  Token keyword_02;
  undefined2 kind_00;
  undefined8 uVar3;
  pointer ppAVar4;
  bool bVar5;
  TokenKind endKind;
  SyntaxKind SVar6;
  int iVar7;
  HierarchyInstantiationSyntax *pHVar8;
  PortDeclarationSyntax *pPVar9;
  NamedLabelSyntax *label_00;
  ImmediateAssertionMemberSyntax *pIVar10;
  ConcurrentAssertionMemberSyntax *pCVar11;
  ImmediateAssertionStatementSyntax *pIVar12;
  ConcurrentAssertionStatementSyntax *pCVar13;
  StatementSyntax *pSVar14;
  ClassDeclarationSyntax *pCVar15;
  ElabSystemTaskSyntax *pEVar16;
  DataDeclarationSyntax *data;
  FunctionDeclarationSyntax *pFVar17;
  Diagnostic *this_00;
  undefined4 extraout_var;
  MemberSyntax *pMVar18;
  SourceLocation SVar19;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_03;
  optional<slang::DiagCode> diagCode;
  SourceRange range;
  string_view arg;
  Token TVar20;
  TokenList local_b58;
  pointer local_b28;
  pointer local_b20;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_b18;
  pointer local_ae8;
  pointer local_ad8;
  pointer ppAStack_ad0;
  string_view local_ac0;
  SourceRange local_ab0;
  DiagCode local_aa0;
  undefined1 local_a90 [8];
  Token qual;
  undefined1 local_a78 [4];
  uint32_t i_1;
  SmallVector<slang::parsing::Token,_4UL> quals;
  SyntaxKind kind;
  _Storage<slang::DiagCode,_true> local_9fa;
  undefined2 local_9f6;
  uint local_9f4;
  undefined1 auStack_9f0 [4];
  uint32_t i;
  DiagCode local_9dc;
  Token local_9d8;
  uint32_t local_9c4;
  undefined1 auStack_9c0 [4];
  uint32_t index;
  Token t;
  MemberSyntax *member;
  AttrList local_958;
  undefined8 local_948;
  Info *local_940;
  pointer local_938;
  pointer local_930;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_928;
  undefined1 local_8f8 [8];
  Token rand;
  span<slang::parsing::Token,_18446744073709551615UL> local_8d8;
  ElabSystemTaskSyntax *local_8c8;
  pointer local_8c0;
  ElabSystemTaskSyntax *local_8b8;
  pointer local_8b0;
  undefined8 local_8a8;
  ElabSystemTaskSyntax *result;
  pointer local_898;
  pointer local_890;
  pointer local_888;
  Token local_880;
  pointer local_870;
  pointer local_868;
  Token local_860;
  ElabSystemTaskSyntax *local_850;
  pointer local_848;
  ElabSystemTaskSyntax *local_840;
  pointer local_838;
  ElabSystemTaskSyntax *local_830;
  pointer local_828;
  Token local_820;
  TokenList local_810;
  ElabSystemTaskSyntax *local_7e0;
  pointer local_7d8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_7d0;
  pointer local_7a0;
  pointer local_798;
  pointer local_790;
  pointer local_788;
  Token local_780;
  pointer local_770;
  pointer local_768;
  pointer local_760;
  pointer local_758;
  Token local_750;
  ElabSystemTaskSyntax *local_740;
  pointer local_738;
  Token local_730;
  pointer local_720;
  pointer local_718;
  Token local_710;
  Token local_700;
  ElabSystemTaskSyntax *local_6f0;
  pointer local_6e8;
  ElabSystemTaskSyntax *local_6e0;
  pointer local_6d8;
  ElabSystemTaskSyntax *local_6d0;
  pointer local_6c8;
  ElabSystemTaskSyntax *local_6c0;
  pointer local_6b8;
  ElabSystemTaskSyntax *local_6b0;
  pointer local_6a8;
  ElabSystemTaskSyntax *local_6a0;
  pointer local_698;
  ElabSystemTaskSyntax *local_690;
  pointer local_688;
  ElabSystemTaskSyntax *local_680;
  pointer local_678;
  undefined8 local_670;
  Info *local_668;
  pointer local_660;
  pointer local_658;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_650;
  undefined1 local_620 [8];
  Token keyword_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_5f0;
  undefined1 local_5c0 [8];
  Token keyword_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_590;
  AttrList local_560;
  ConcurrentAssertionStatementSyntax *local_550;
  ConcurrentAssertionStatementSyntax *statement_2;
  pointer local_540;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_538;
  ConcurrentAssertionStatementSyntax *local_508;
  pointer local_500;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_4f8;
  AttrList local_4c8;
  StatementSyntax *local_4b8;
  StatementSyntax *statement_1;
  pointer local_4a8;
  StatementSyntax *local_4a0;
  pointer local_498;
  Token local_490;
  Token local_480;
  Token local_470;
  pointer local_460;
  pointer local_458;
  pointer local_450;
  pointer local_448;
  Token local_440;
  Token local_430;
  Token local_420;
  pointer local_410;
  pointer local_408;
  Token local_400;
  Token local_3f0;
  pointer local_3e0;
  pointer local_3d8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_3d0;
  pointer local_3a0;
  pointer local_398;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_390;
  AttrList local_360;
  StatementSyntax *local_350;
  StatementSyntax *statement;
  NamedLabelSyntax *local_338;
  Info *pIStack_330;
  NamedLabelSyntax *local_328;
  NamedLabelSyntax *label;
  Token name;
  TokenKind TStack_2f8;
  TokenKind next;
  TokenKind local_258;
  TokenList local_1f0;
  pointer local_1c0;
  pointer local_1b8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_1b0;
  ElabSystemTaskSyntax *local_180;
  pointer local_178;
  size_type local_170;
  pointer local_160;
  pointer local_158;
  SyntaxList<slang::syntax::MemberSyntax> local_150;
  Info *local_120;
  Info *local_118;
  pointer local_110;
  pointer local_108;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_100;
  anon_class_8_1_8991fb9c local_d0;
  undefined1 local_c8 [8];
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endgenerate;
  Token keyword;
  undefined1 local_88 [8];
  Token token;
  undefined1 auStack_38 [8];
  AttrList attributes;
  bool *anyLocalModules_local;
  SyntaxKind parentKind_local;
  Parser *this_local;
  
  attributes.size_ = (size_type)anyLocalModules;
  _auStack_38 = parseAttributes(this);
  bVar5 = isHierarchyInstantiation(this,false);
  if (bVar5) {
    pHVar8 = parseHierarchyInstantiation(this,_auStack_38);
    return &pHVar8->super_MemberSyntax;
  }
  bVar5 = isPortDeclaration(this,false);
  if (bVar5) {
    pPVar9 = parsePortDeclaration(this,_auStack_38);
    return &pPVar9->super_MemberSyntax;
  }
  bVar5 = isNetDeclaration(this);
  if (bVar5) {
    pMVar18 = parseNetDeclaration(this,_auStack_38);
    return pMVar18;
  }
  bVar5 = isVariableDeclaration(this);
  if (bVar5) {
    token.info = (Info *)auStack_38;
    pMVar18 = parseVariableDeclaration(this,_auStack_38);
    return pMVar18;
  }
  _local_88 = ParserBase::peek(&this->super_ParserBase);
  switch(local_88._0_4_ - 2 & 0xffff) {
  case 0:
    TVar20 = ParserBase::peek(&this->super_ParserBase,1);
    TStack_2f8 = TVar20.kind;
    if (TStack_2f8 == Colon) {
      join_0x00000010_0x00000000_ = ParserBase::peek(&this->super_ParserBase,2);
      if ((((TokenKind)name.info == AssertKeyword) || ((TokenKind)name.info == AssumeKeyword)) ||
         ((TokenKind)name.info == CoverKeyword)) {
        _label = ParserBase::consume(&this->super_ParserBase);
        local_338 = label;
        pIStack_330 = (Info *)name._0_8_;
        _statement = ParserBase::expect(&this->super_ParserBase,Colon);
        name_00.info = pIStack_330;
        name_00._0_8_ = local_338;
        label_00 = slang::syntax::SyntaxFactory::namedLabel(&this->factory,name_00,_statement);
        local_328 = label_00;
        nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::
        span<true,_0>(&local_360);
        local_350 = parseAssertionStatement(this,label_00,local_360);
        SVar6 = (local_350->super_SyntaxNode).kind;
        if ((SVar6 != ImmediateAssertStatement) &&
           (SVar6 != ImmediateAssumeStatement && SVar6 != ImmediateCoverStatement)) {
          local_3e0 = (pointer)auStack_38;
          local_3d8 = attributes.data_;
          slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                    (&local_3d0,_auStack_38);
          pCVar13 = slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                              (&local_350->super_SyntaxNode);
          pCVar11 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                              (&this->factory,&local_3d0,pCVar13);
          return &pCVar11->super_MemberSyntax;
        }
        local_3a0 = (pointer)auStack_38;
        local_398 = attributes.data_;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (&local_390,_auStack_38);
        pIVar12 = slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                            (&local_350->super_SyntaxNode);
        pIVar10 = slang::syntax::SyntaxFactory::immediateAssertionMember
                            (&this->factory,&local_390,pIVar12);
        return &pIVar10->super_MemberSyntax;
      }
    }
    local_3f0 = ParserBase::peek(&this->super_ParserBase,1);
    bVar5 = true;
    if (local_3f0.kind != Hash) {
      local_400 = ParserBase::peek(&this->super_ParserBase,1);
      bVar5 = local_400.kind == OpenParenthesis;
    }
    if (bVar5) {
      local_410 = (pointer)auStack_38;
      local_408 = attributes.data_;
      this_local = (Parser *)parsePrimitiveInstantiation(this,_auStack_38);
    }
    else {
      local_420 = ParserBase::peek(&this->super_ParserBase,1);
      bVar5 = false;
      if (local_420.kind == DoubleColon) {
        local_430 = ParserBase::peek(&this->super_ParserBase,2);
        bVar5 = false;
        if (local_430.kind == Identifier) {
          local_440 = ParserBase::peek(&this->super_ParserBase,3);
          bVar5 = local_440.kind == Identifier;
        }
      }
      if (bVar5) {
        local_450 = (pointer)auStack_38;
        local_448 = attributes.data_;
        this_local = (Parser *)parseCheckerInstantiation(this,_auStack_38);
      }
      else {
        local_460 = (pointer)auStack_38;
        local_458 = attributes.data_;
        this_local = (Parser *)parseVariableDeclaration(this,_auStack_38);
      }
    }
    break;
  case 1:
    local_8b8 = (ElabSystemTaskSyntax *)auStack_38;
    local_8b0 = attributes.data_;
    pEVar16 = parseElabSystemTask(this,_auStack_38);
    if (pEVar16 != (ElabSystemTaskSyntax *)0x0) {
      return &pEVar16->super_MemberSyntax;
    }
    local_8a8 = 0;
    goto LAB_00575c9f;
  default:
    goto LAB_00575c9f;
  case 0x13:
    local_7e0 = (ElabSystemTaskSyntax *)auStack_38;
    local_7d8 = attributes.data_;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_7d0,_auStack_38);
    slang::syntax::TokenList::TokenList(&local_810,(nullptr_t)0x0);
    local_820 = ParserBase::consume(&this->super_ParserBase);
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::emptyMember
                           (&this->factory,&local_7d0,&local_810,local_820);
    break;
  case 0x5d:
    this_local = (Parser *)parseNetAlias(this,_auStack_38);
    break;
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0xa7:
    _local_620 = ParserBase::consume(&this->super_ParserBase);
    SVar6 = slang::syntax::SyntaxFacts::getProceduralBlockKind(local_620._0_2_);
    local_660 = (pointer)auStack_38;
    local_658 = attributes.data_;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_650,_auStack_38);
    local_670 = local_620;
    local_668 = (Info *)keyword_2._0_8_;
    pSVar14 = parseStatement(this,false,false);
    keyword_00.info = local_668;
    keyword_00.kind = (undefined2)local_670;
    keyword_00._2_1_ = local_670._2_1_;
    keyword_00.numFlags.raw = local_670._3_1_;
    keyword_00.rawLen = local_670._4_4_;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::proceduralBlock
                           (&this->factory,SVar6,&local_650,keyword_00,pSVar14);
    break;
  case 99:
  case 0x65:
  case 0x80:
    nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::
    span<true,_0>(&local_4c8);
    local_4b8 = parseAssertionStatement(this,(NamedLabelSyntax *)0x0,local_4c8);
    SVar6 = (local_4b8->super_SyntaxNode).kind;
    if ((SVar6 == ImmediateAssertStatement) ||
       (SVar6 == ImmediateAssumeStatement || SVar6 == ImmediateCoverStatement)) {
      local_508 = (ConcurrentAssertionStatementSyntax *)auStack_38;
      local_500 = attributes.data_;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (&local_4f8,_auStack_38);
      pIVar12 = slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                          (&local_4b8->super_SyntaxNode);
      this_local = (Parser *)
                   slang::syntax::SyntaxFactory::immediateAssertionMember
                             (&this->factory,&local_4f8,pIVar12);
    }
    else {
      statement_2 = (ConcurrentAssertionStatementSyntax *)auStack_38;
      local_540 = attributes.data_;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (&local_538,_auStack_38);
      pCVar13 = slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                          (&local_4b8->super_SyntaxNode);
      this_local = (Parser *)
                   slang::syntax::SyntaxFactory::concurrentAssertionMember
                             (&this->factory,&local_538,pCVar13);
    }
    break;
  case 100:
    keyword_1.info = (Info *)auStack_38;
    this_local = (Parser *)parseContinuousAssign(this,_auStack_38);
    break;
  case 0x68:
    local_180 = (ElabSystemTaskSyntax *)auStack_38;
    local_178 = attributes.data_;
    errorIfAttributes(this,_auStack_38);
    bVar5 = nonstd::span_lite::
            span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                       auStack_38);
    if (bVar5) {
      SVar19 = Token::location((Token *)local_88);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x940005,SVar19);
      this_local = (Parser *)parseGenerateBlock(this);
    }
    else {
      local_1c0 = (pointer)auStack_38;
      local_1b8 = attributes.data_;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (&local_1b0,_auStack_38);
      slang::syntax::TokenList::TokenList(&local_1f0,(nullptr_t)0x0);
      pBVar1 = (this->super_ParserBase).alloc;
      SVar19 = Token::location((Token *)local_88);
      TVar20 = Token::createMissing(pBVar1,Semicolon,SVar19);
      this_local = (Parser *)
                   slang::syntax::SyntaxFactory::emptyMember
                             (&this->factory,&local_1b0,&local_1f0,TVar20);
    }
    break;
  case 0x69:
    this_local = (Parser *)parseBindDirective(this,_auStack_38);
    break;
  case 0x72:
    local_6a0 = (ElabSystemTaskSyntax *)auStack_38;
    local_698 = attributes.data_;
    this_local = (Parser *)parseCaseGenerateConstruct(this,_auStack_38);
    break;
  case 0x77:
    local_850 = (ElabSystemTaskSyntax *)auStack_38;
    local_848 = attributes.data_;
    this_local = (Parser *)parseCheckerDeclaration(this,_auStack_38);
    break;
  case 0x78:
    local_6f0 = (ElabSystemTaskSyntax *)auStack_38;
    local_6e8 = attributes.data_;
    Token::Token(&local_700);
    attributes_03.size_ = (size_type)local_6e8;
    attributes_03.data_ = (pointer)local_6f0;
    this_local = (Parser *)parseClassDeclaration(this,attributes_03,local_700);
    break;
  case 0x79:
    result = (ElabSystemTaskSyntax *)auStack_38;
    local_898 = attributes.data_;
    this_local = (Parser *)parseClockingDeclaration(this,_auStack_38);
    break;
  case 0x7b:
    errorIfAttributes(this,_auStack_38);
    this_local = (Parser *)parseConfigDeclaration(this,_auStack_38);
    break;
  case 0x7d:
    local_8c8 = (ElabSystemTaskSyntax *)auStack_38;
    local_8c0 = attributes.data_;
    nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::span<true,_0>
              (&local_8d8);
    attributes_02.size_ = (size_type)local_8c0;
    attributes_02.data_ = (pointer)local_8c8;
    this_local = (Parser *)parseConstraint(this,attributes_02,local_8d8);
    break;
  case 0x81:
    local_6e0 = (ElabSystemTaskSyntax *)auStack_38;
    local_6d8 = attributes.data_;
    this_local = (Parser *)parseCovergroupDeclaration(this,_auStack_38);
    break;
  case 0x85:
  case 0xb2:
    local_860 = ParserBase::peek(&this->super_ParserBase,1);
    if (local_860.kind == ClockingKeyword) {
      local_870 = (pointer)auStack_38;
      local_868 = attributes.data_;
      pMVar18 = parseClockingDeclaration(this,_auStack_38);
      return pMVar18;
    }
    local_880 = ParserBase::peek(&this->super_ParserBase,1);
    bVar5 = false;
    if (local_880.kind == DisableKeyword) {
      bVar5 = local_88._0_2_ == DefaultKeyword;
    }
    if (bVar5) {
      local_890 = (pointer)auStack_38;
      local_888 = attributes.data_;
      pMVar18 = parseDefaultDisable(this,_auStack_38);
      return pMVar18;
    }
    goto LAB_00575c9f;
  case 0x86:
    local_740 = (ElabSystemTaskSyntax *)auStack_38;
    local_738 = attributes.data_;
    this_local = (Parser *)parseDefParam(this,_auStack_38);
    break;
  case 0xa4:
    local_780 = ParserBase::peek(&this->super_ParserBase,1);
    if (local_780.kind == StringLiteral) {
      local_790 = (pointer)auStack_38;
      local_788 = attributes.data_;
      this_local = (Parser *)parseDPIExport(this,_auStack_38);
    }
    else {
      local_7a0 = (pointer)auStack_38;
      local_798 = attributes.data_;
      this_local = (Parser *)parseExportDeclaration(this,_auStack_38);
    }
    break;
  case 0xa6:
    errorIfAttributes(this,_auStack_38);
    pMVar18 = parseExternMember(this,parentKind,_auStack_38);
    if (pMVar18 != (MemberSyntax *)0x0) {
      return pMVar18;
    }
    goto LAB_00575c9f;
  case 0xa9:
    local_680 = (ElabSystemTaskSyntax *)auStack_38;
    local_678 = attributes.data_;
    this_local = (Parser *)parseLoopGenerateConstruct(this,_auStack_38);
    break;
  case 0xaf:
    local_6d0 = (ElabSystemTaskSyntax *)auStack_38;
    local_6c8 = attributes.data_;
    this_local = (Parser *)
                 parseFunctionDeclaration
                           (this,_auStack_38,FunctionDeclaration,EndFunctionKeyword,parentKind);
    break;
  case 0xb0:
    errorIfAttributes(this,_auStack_38);
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    Token::Token((Token *)&members.size_);
    local_d0.this = this;
    _local_c8 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
                          (this,EndGenerateKeyword,(Token *)&members.size_,GenerateRegion,&local_d0)
    ;
    local_110 = (pointer)auStack_38;
    local_108 = attributes.data_;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_100,_auStack_38);
    endgenerate.info = TVar20._0_8_;
    local_120 = endgenerate.info;
    keyword._0_8_ = TVar20.info;
    local_118 = (Info *)keyword._0_8_;
    local_160 = (pointer)local_c8;
    local_158 = members.data_;
    slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&local_150,_local_c8);
    local_170 = members.size_;
    keyword_02.info = local_118;
    keyword_02._0_8_ = local_120;
    endgenerate_00.info = (Info *)endgenerate._0_8_;
    endgenerate_00.kind = (undefined2)members.size_;
    endgenerate_00._2_1_ = members.size_._2_1_;
    endgenerate_00.numFlags.raw = members.size_._3_1_;
    endgenerate_00.rawLen = members.size_._4_4_;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::generateRegion
                           (&this->factory,&local_100,keyword_02,&local_150,endgenerate_00);
    break;
  case 0xb1:
    local_6b0 = (ElabSystemTaskSyntax *)auStack_38;
    local_6a8 = attributes.data_;
    this_local = (Parser *)parseGenvarDeclaration(this,_auStack_38);
    break;
  case 0xb5:
    local_690 = (ElabSystemTaskSyntax *)auStack_38;
    local_688 = attributes.data_;
    this_local = (Parser *)parseIfGenerateConstruct(this,_auStack_38);
    break;
  case 0xbc:
    local_750 = ParserBase::peek(&this->super_ParserBase,1);
    if (local_750.kind == StringLiteral) {
      local_760 = (pointer)auStack_38;
      local_758 = attributes.data_;
      this_local = (Parser *)parseDPIImport(this,_auStack_38);
    }
    else {
      local_770 = (pointer)auStack_38;
      local_768 = attributes.data_;
      this_local = (Parser *)parseImportDeclaration(this,_auStack_38);
    }
    break;
  case 0xbf:
    _local_5c0 = ParserBase::consume(&this->super_ParserBase);
    SVar6 = slang::syntax::SyntaxFacts::getProceduralBlockKind(local_5c0._0_2_);
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_5f0,_auStack_38);
    keyword_2.info = (Info *)local_5c0;
    uVar3 = keyword_1._0_8_;
    pSVar14 = parseStatement(this,true,false);
    keyword_01.info = (Info *)uVar3;
    keyword_01._0_8_ = keyword_2.info;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::proceduralBlock
                           (&this->factory,SVar6,&local_5f0,keyword_01,pSVar14);
    break;
  case 199:
    TVar20 = ParserBase::peek(&this->super_ParserBase,1);
    AVar2 = _auStack_38;
    local_258 = TVar20.kind;
    if (local_258 == ClassKeyword) {
      TVar20 = ParserBase::consume(&this->super_ParserBase);
      this_local = (Parser *)parseClassDeclaration(this,AVar2,TVar20);
    }
    else {
      this_local = (Parser *)parseModule(this,_auStack_38,parentKind,(bool *)attributes.size_);
    }
    break;
  case 0xd4:
  case 0xd8:
  case 0xe7:
  case 0xee:
    this_local = (Parser *)parseModule(this,_auStack_38,parentKind,(bool *)attributes.size_);
    break;
  case 0xd7:
    this_local = (Parser *)parseModportDeclaration(this,_auStack_38);
    break;
  case 0xec:
    rand.info = (Info *)auStack_38;
    this_local = (Parser *)parseUdpDeclaration(this,_auStack_38);
    break;
  case 0xef:
    local_830 = (ElabSystemTaskSyntax *)auStack_38;
    local_828 = attributes.data_;
    this_local = (Parser *)parsePropertyDeclaration(this,_auStack_38);
    break;
  case 0xf8:
    _local_8f8 = ParserBase::consume(&this->super_ParserBase);
    local_938 = (pointer)auStack_38;
    local_930 = attributes.data_;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_928,_auStack_38);
    local_948 = local_8f8;
    local_940 = (Info *)rand._0_8_;
    nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::
    span<true,_0>(&local_958);
    data = parseDataDeclaration(this,local_958);
    rand_00.info = local_940;
    rand_00.kind = (undefined2)local_948;
    rand_00._2_1_ = local_948._2_1_;
    rand_00.numFlags.raw = local_948._3_1_;
    rand_00.rawLen = local_948._4_4_;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::checkerDataDeclaration
                           (&this->factory,&local_928,rand_00,data);
    break;
  case 0x104:
    nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::
    span<true,_0>(&local_560);
    local_550 = parseConcurrentAssertion(this,(NamedLabelSyntax *)0x0,local_560);
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_590,_auStack_38);
    pCVar13 = slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                        ((SyntaxNode *)local_550);
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::concurrentAssertionMember
                           (&this->factory,&local_590,pCVar13);
    break;
  case 0x111:
    local_840 = (ElabSystemTaskSyntax *)auStack_38;
    local_838 = attributes.data_;
    this_local = (Parser *)parseSequenceDeclaration(this,_auStack_38);
    break;
  case 0x119:
    errorIfAttributes(this,_auStack_38);
    this_local = (Parser *)parseSpecifyBlock(this,_auStack_38);
    break;
  case 0x11a:
    this_local = (Parser *)parseSpecparam(this,_auStack_38);
    break;
  case 0x128:
    local_6c0 = (ElabSystemTaskSyntax *)auStack_38;
    local_6b8 = attributes.data_;
    this_local = (Parser *)
                 parseFunctionDeclaration
                           (this,_auStack_38,TaskDeclaration,EndTaskKeyword,parentKind);
    break;
  case 300:
  case 0x12d:
    errorIfAttributes(this,_auStack_38);
    this_local = (Parser *)parseTimeUnitsDeclaration(this,_auStack_38);
    break;
  case 0x144:
    local_710 = ParserBase::peek(&this->super_ParserBase,1);
    if (local_710.kind == ClassKeyword) {
      local_720 = (pointer)auStack_38;
      local_718 = attributes.data_;
      local_730 = ParserBase::consume(&this->super_ParserBase);
      AVar2.size_ = (size_type)local_718;
      AVar2.data_ = local_720;
      pCVar15 = parseClassDeclaration(this,AVar2,local_730);
      return &pCVar15->super_MemberSyntax;
    }
LAB_00575c9f:
    bVar5 = slang::syntax::SyntaxFacts::isGateType(local_88._0_2_);
    if (bVar5) {
      t.info = (Info *)auStack_38;
      this_local = (Parser *)parsePrimitiveInstantiation(this,_auStack_38);
    }
    else {
      bVar5 = slang::syntax::SyntaxFacts::isMethodQualifier(local_88._0_2_);
      if (bVar5) {
        Token::Token((Token *)auStack_9c0);
        local_9c4 = 0;
        do {
          local_9c4 = local_9c4 + 1;
          TVar20 = ParserBase::peek(&this->super_ParserBase,local_9c4);
          local_9d8._0_8_ = TVar20._0_8_;
          auStack_9c0._0_2_ = local_9d8.kind;
          auStack_9c0[2] = local_9d8._2_1_;
          auStack_9c0[3] = local_9d8.numFlags.raw;
          index = local_9d8.rawLen;
          uVar3 = _auStack_9c0;
          local_9d8.info = TVar20.info;
          t._0_8_ = local_9d8.info;
          auStack_9c0._0_2_ = TVar20.kind;
          kind_00 = auStack_9c0._0_2_;
          local_9d8 = TVar20;
          _auStack_9c0 = uVar3;
          bVar5 = slang::syntax::SyntaxFacts::isMethodQualifier(kind_00);
        } while (bVar5);
        if ((auStack_9c0._0_2_ == FunctionKeyword) || (auStack_9c0._0_2_ == TaskKeyword)) {
          local_9dc.subsystem = Parser;
          local_9dc.code = 0x7e;
          _auStack_9f0 = Token::range((Token *)local_88);
          ParserBase::addDiag(&this->super_ParserBase,local_9dc,_auStack_9f0);
          for (local_9f4 = 0; AVar2 = _auStack_38, local_9f4 < local_9c4; local_9f4 = local_9f4 + 1)
          {
            std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_9fa);
            diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
            super__Optional_payload_base<slang::DiagCode>._4_2_ = local_9f6;
            diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
            super__Optional_payload_base<slang::DiagCode>._M_payload = local_9fa;
            ParserBase::skipToken(&this->super_ParserBase,diagCode);
          }
          SVar6 = TaskDeclaration;
          if (auStack_9c0._0_2_ == FunctionKeyword) {
            SVar6 = FunctionDeclaration;
          }
          quals.stackBase[0x28] = auStack_38[0];
          quals.stackBase[0x29] = auStack_38[1];
          quals.stackBase[0x2a] = auStack_38[2];
          quals.stackBase[0x2b] = auStack_38[3];
          quals.stackBase[0x2c] = auStack_38[4];
          quals.stackBase[0x2d] = auStack_38[5];
          quals.stackBase[0x2e] = auStack_38[6];
          quals.stackBase[0x2f] = auStack_38[7];
          attributes.data_ = (pointer)AVar2.size_;
          ppAVar4 = attributes.data_;
          _auStack_38 = AVar2;
          endKind = slang::syntax::SyntaxFacts::getSkipToKind(auStack_9c0._0_2_);
          attributes_01.size_ = (size_type)ppAVar4;
          attributes_01.data_ = (pointer)quals.stackBase._40_8_;
          pFVar17 = parseFunctionDeclaration(this,attributes_01,SVar6,endKind,parentKind);
          return &pFVar17->super_MemberSyntax;
        }
        if (auStack_9c0._0_2_ == ConstraintKeyword) {
          SmallVector<slang::parsing::Token,_4UL>::SmallVector
                    ((SmallVector<slang::parsing::Token,_4UL> *)local_a78);
          src = extraout_RDX;
          for (qual.info._4_4_ = 0; qual.info._4_4_ < local_9c4;
              qual.info._4_4_ = qual.info._4_4_ + 1) {
            TVar20 = ParserBase::consume(&this->super_ParserBase);
            qual._0_8_ = TVar20.info;
            local_a90 = TVar20._0_8_;
            SmallVectorBase<slang::parsing::Token>::push_back
                      ((SmallVectorBase<slang::parsing::Token> *)local_a78,(Token *)local_a90);
            src = extraout_RDX_00;
            if (local_a90._0_2_ != StaticKeyword) {
              bVar5 = slang::syntax::SyntaxFacts::isConstraintQualifier(local_a90._0_2_);
              src = extraout_RDX_01;
              if (bVar5) {
                local_aa0.subsystem = Parser;
                local_aa0.code = 6;
                range = Token::range((Token *)local_a90);
                local_ab0 = range;
                this_00 = ParserBase::addDiag(&this->super_ParserBase,local_aa0,range);
                arg = Token::valueText((Token *)local_a90);
                local_ac0 = arg;
                Diagnostic::operator<<(this_00,arg);
                src = extraout_RDX_02;
              }
            }
          }
          local_ad8 = (pointer)auStack_38;
          ppAStack_ad0 = attributes.data_;
          iVar7 = SmallVectorBase<slang::parsing::Token>::copy
                            ((SmallVectorBase<slang::parsing::Token> *)local_a78,
                             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
          local_ae8 = (pointer)CONCAT44(extraout_var,iVar7);
          attributes_00.size_ = (size_type)ppAStack_ad0;
          attributes_00.data_ = local_ad8;
          qualifiers.size_ = extraout_RDX_03;
          qualifiers.data_ = local_ae8;
          pMVar18 = parseConstraint(this,attributes_00,qualifiers);
          SmallVector<slang::parsing::Token,_4UL>::~SmallVector
                    ((SmallVector<slang::parsing::Token,_4UL> *)local_a78);
          return pMVar18;
        }
      }
      bVar5 = nonstd::span_lite::
              span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                        ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                         auStack_38);
      if (bVar5) {
        this_local = (Parser *)0x0;
      }
      else {
        local_b28 = (pointer)auStack_38;
        local_b20 = attributes.data_;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (&local_b18,_auStack_38);
        slang::syntax::TokenList::TokenList(&local_b58,(nullptr_t)0x0);
        pBVar1 = (this->super_ParserBase).alloc;
        SVar19 = Token::location((Token *)local_88);
        TVar20 = Token::createMissing(pBVar1,Semicolon,SVar19);
        this_local = (Parser *)
                     slang::syntax::SyntaxFactory::emptyMember
                               (&this->factory,&local_b18,&local_b58,TVar20);
      }
    }
    break;
  case 0x154:
    local_470 = ParserBase::peek(&this->super_ParserBase,1);
    bVar5 = false;
    if (local_470.kind == DoubleColon) {
      local_480 = ParserBase::peek(&this->super_ParserBase,2);
      bVar5 = false;
      if (local_480.kind == Identifier) {
        local_490 = ParserBase::peek(&this->super_ParserBase,3);
        bVar5 = local_490.kind == Identifier;
      }
    }
    if (bVar5) {
      local_4a0 = (StatementSyntax *)auStack_38;
      local_498 = attributes.data_;
      this_local = (Parser *)parseCheckerInstantiation(this,_auStack_38);
    }
    else {
      statement_1 = (StatementSyntax *)auStack_38;
      local_4a8 = attributes.data_;
      this_local = (Parser *)parseVariableDeclaration(this,_auStack_38);
    }
  }
  return (MemberSyntax *)this_local;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {});
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc));
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}